

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O3

void __thiscall cppcms::http::content_type::parse(content_type *this,char *begin,char *end)

{
  byte bVar1;
  element_type *peVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Alloc_hider end_00;
  long lVar6;
  size_type sVar7;
  byte bVar8;
  long *plVar9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char *tmp;
  string value;
  string subtype;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  pcVar3 = protocol::skip_ws<char_const*>(begin,end);
  if ((pcVar3 != end) && (pcVar4 = protocol::tocken<char_const*>(pcVar3,end), pcVar4 != pcVar3)) {
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar3,pcVar4);
    if ((pcVar4 != end) && (*pcVar4 == '/')) {
      plVar9 = (long *)(pcVar4 + 1);
      p = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)protocol::tocken<char_const*>((char *)plVar9,end);
      if (p != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)plVar9) {
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,plVar9,p);
        if (local_88 != 0) {
          lVar6 = 0;
          do {
            bVar1 = local_90[lVar6];
            bVar8 = bVar1 | 0x20;
            if ((byte)(bVar1 + 0xa5) < 0xe6) {
              bVar8 = bVar1;
            }
            local_90[lVar6] = bVar8;
            lVar6 = lVar6 + 1;
          } while (local_88 != lVar6);
        }
        if (local_a8 != 0) {
          lVar6 = 0;
          do {
            bVar1 = local_b0[lVar6];
            bVar8 = bVar1 | 0x20;
            if ((byte)(bVar1 + 0xa5) < 0xe6) {
              bVar8 = bVar1;
            }
            local_b0[lVar6] = bVar8;
            lVar6 = lVar6 + 1;
          } while (local_a8 != lVar6);
        }
        std::__cxx11::string::_M_assign
                  ((string *)
                   (this->d).
                   super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &((this->d).
                     super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->subtype);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_90,local_90 + local_88);
        std::__cxx11::string::append((char *)&local_f8);
        plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b0);
        paVar5 = &local_70.first.field_2;
        end_00._M_p = (pointer)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)end_00._M_p) {
          local_70.first.field_2._M_allocated_capacity = *(undefined8 *)end_00._M_p;
          local_70.first.field_2._8_8_ = plVar9[3];
          local_70.first._M_dataplus._M_p = (pointer)paVar5;
        }
        else {
          local_70.first.field_2._M_allocated_capacity = *(undefined8 *)end_00._M_p;
          local_70.first._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_70.first._M_string_length = plVar9[1];
        *plVar9 = (long)end_00._M_p;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)
                   &((this->d).
                     super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->media_type,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.first._M_dataplus._M_p != paVar5) {
          operator_delete(local_70.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        do {
          if ((((p == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)end) ||
               (pcVar3 = protocol::skip_ws<char_const*>(p->_M_local_buf,end), pcVar3 == end)) ||
              (*pcVar3 != ';')) ||
             ((pcVar3 = protocol::skip_ws<char_const*>(pcVar3 + 1,end), pcVar3 == end ||
              (pcVar4 = protocol::tocken<char_const*>(pcVar3,end), pcVar4 == pcVar3)))) break;
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,pcVar3,pcVar4);
          if (local_f8._M_string_length != 0) {
            sVar7 = 0;
            do {
              bVar1 = local_f8._M_dataplus._M_p[sVar7];
              bVar8 = bVar1 | 0x20;
              if ((byte)(bVar1 + 0xa5) < 0xe6) {
                bVar8 = bVar1;
              }
              local_f8._M_dataplus._M_p[sVar7] = bVar8;
              sVar7 = sVar7 + 1;
              end_00._M_p = local_f8._M_dataplus._M_p;
            } while (local_f8._M_string_length != sVar7);
          }
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)protocol::skip_ws<char_const*>(pcVar4,end);
          p = paVar5;
          if (paVar5 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)end) {
LAB_001e2f96:
            bVar10 = false;
          }
          else {
            p = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar5->_M_local_buf + 1);
            if (paVar5->_M_local_buf[0] == '=') {
              p = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)protocol::skip_ws<char_const*>(p->_M_local_buf,end);
              if (p == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)end) goto LAB_001e2f96;
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              local_d0._M_string_length = 0;
              local_d0.field_2._M_local_buf[0] = '\0';
              if (p->_M_local_buf[0] == '\"') {
                local_d8 = p;
                protocol::unquote<char_const*>
                          (&local_70.first,(protocol *)&local_d8,(char **)end,end_00._M_p);
                std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
                  operator_delete(local_70.first._M_dataplus._M_p);
                }
                bVar10 = local_d8 == p;
                p = local_d8;
                if (bVar10) goto LAB_001e304c;
LAB_001e2fd8:
                peVar2 = (this->d).
                         super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          (&local_70,&local_f8,&local_d0);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&peVar2->parameters,&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
                  operator_delete(local_70.second._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
                  operator_delete(local_70.first._M_dataplus._M_p);
                }
                bVar10 = true;
              }
              else {
                paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)protocol::tocken<char_const*>(p->_M_local_buf,end);
                if (paVar5 != p) {
                  std::__cxx11::string::replace
                            ((ulong)&local_d0,0,(char *)local_d0._M_string_length,(ulong)p);
                  end_00._M_p = (pointer)p;
                  p = paVar5;
                  goto LAB_001e2fd8;
                }
LAB_001e304c:
                bVar10 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
            }
            else {
              bVar10 = false;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
        } while (bVar10);
        if (local_b0 != local_a0) {
          operator_delete(local_b0);
        }
      }
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
  }
  return;
}

Assistant:

void content_type::parse(char const *begin,char const *end)
	{
		begin = protocol::skip_ws(begin,end);	
		if(begin == end)
			return;
		char const *type_end = protocol::tocken(begin,end);
		if(type_end == begin)
			return;
		std::string type(begin,type_end);
		begin = type_end;
		if(begin == end || *begin++ != '/')
			return;
		type_end = protocol::tocken(begin,end);
		if(type_end == begin)
			return;
		std::string subtype(begin,type_end);
		begin = type_end;
		std::transform(type.begin(),type.end(),type.begin(),protocol::ascii_to_lower);
		std::transform(subtype.begin(),subtype.end(),subtype.begin(),protocol::ascii_to_lower);
		d->type = type;
		d->subtype = subtype;
		d->media_type = type + "/" + subtype;
		while(begin!=end) {
			begin = protocol::skip_ws(begin,end);
			if(begin == end || *begin++ != ';' || (begin=protocol::skip_ws(begin,end))==end)
				return;
			char const *param_end = protocol::tocken(begin,end);
			if(param_end == begin)
				return;
			std::string param(begin,param_end);
			std::transform(param.begin(),param.end(),param.begin(),protocol::ascii_to_lower);
			begin = protocol::skip_ws(param_end,end);
			if(begin==end || *begin++!='=')
				return;
			begin = protocol::skip_ws(begin,end);
			if(begin==end)
				return;
			std::string value;
			if(*begin == '"') {
				char const *tmp = begin;
				value = protocol::unquote(tmp,end);
				if(tmp == begin)
					return;
				begin = tmp;
			}
			else {
				char const *tmp = protocol::tocken(begin,end);
				if(tmp == begin)
					return;
				value.assign(begin,tmp);
				begin = tmp;
			}
			d->parameters.insert(std::make_pair(param,value));
		}
	}